

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableDeathTest_InsertMaxSizeOverflow_Test::TestBody
          (HashtableDeathTest_InsertMaxSizeOverflow_Test *this)

{
  bool bVar1;
  int i;
  long lVar2;
  char *local_148;
  undefined8 local_140;
  char local_138 [16];
  key_equal local_128;
  long *local_118;
  int local_110;
  vector<int,_std::allocator<int>_> test_data;
  dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_> dhs;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_> shs;
  
  std::vector<int,_std::allocator<int>_>::vector(&test_data,0x100,(allocator_type *)&shs);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    test_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar2] = (int)lVar2 + 1000;
  }
  local_148 = (char *)0x0;
  local_140 = (int *)((ulong)local_140._4_4_ << 0x20);
  local_118 = (long *)0x0;
  local_110 = 0;
  dhs.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.super_Hasher.id_ = 0;
  dhs.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.super_Hasher.
  num_compares_ = 0;
  dhs.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.enlarge_threshold_ =
       '\0';
  dhs.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.shrink_threshold_ =
       '\0';
  dhs.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>._14_2_ = 0;
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  sparse_hash_set(&shs,'\0',(hasher *)&local_148,(key_equal *)&local_118,(allocator_type *)&dhs);
  local_118 = (long *)0x0;
  local_110 = 0;
  local_128.id_ = 0;
  local_128.num_hashes_ = 0;
  local_128.num_compares_ = 0;
  local_148 = (char *)((ulong)local_148 & 0xffffffff00000000);
  local_140 = (int *)0x0;
  google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  dense_hash_set(&dhs,'\0',(hasher *)&local_118,&local_128,(allocator_type *)&local_148);
  local_148 = (char *)CONCAT44(local_148._4_4_,-1);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
  ::set_empty_key(&dhs.rep,(key_type *)&local_148);
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_140 = (int *)0x0;
  local_148 = local_138;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    google::
    dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
    ::insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
                *)&dhs,test_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
               test_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 0xb);
  }
  std::__cxx11::string::assign((char *)&local_148);
  testing::Message::Message((Message *)&local_118);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_128,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x636,local_148);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_118);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118 !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  std::__cxx11::string::~string((string *)&local_148);
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_140 = (int *)0x0;
  local_148 = local_138;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    google::
    sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
    ::insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
                *)&shs,test_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
               test_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 0xb);
  }
  std::__cxx11::string::assign((char *)&local_148);
  testing::Message::Message((Message *)&local_118);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_128,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x638,local_148);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_118);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118 !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*local_118 + 8))();
  }
  std::__cxx11::string::~string((string *)&local_148);
  free(dhs.rep.table);
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>,_unsigned_char,_(unsigned_char)'\n'>_>
  ::~vector(&shs.rep.table.groups);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&test_data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(HashtableDeathTest, InsertMaxSizeOverflow) {
  static const int kMax = 256;
  vector<int> test_data(kMax);
  for (int i = 0; i < kMax; ++i) {
    test_data[i] = i + 1000;
  }

  sparse_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> shs;
  dense_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> dhs;
  dhs.set_empty_key(-1);

  // Test max_size overflow
  EXPECT_THROW(dhs.insert(test_data.begin(), test_data.begin() + 11),
               std::length_error);
  EXPECT_THROW(shs.insert(test_data.begin(), test_data.begin() + 11),
               std::length_error);
}